

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O2

void irr::executeBlit_TextureCombineColor_16_to_24(SBlitJob *job)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  u16 c1;
  u16 uVar6;
  u32 uVar7;
  uint uVar8;
  ulong uVar9;
  void *pvVar10;
  u16 *puVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  u16 *puVar15;
  
  uVar3 = job->width;
  uVar4 = job->height;
  puVar11 = (u16 *)job->src;
  pvVar10 = job->dst;
  c1 = video::A8R8G8B8toA1R5G5B5(job->argb);
  if (job->stretch == false) {
    for (uVar8 = 0; uVar8 != uVar4; uVar8 = uVar8 + 1) {
      puVar15 = puVar11;
      for (uVar12 = 0; (ulong)uVar3 * 3 != uVar12; uVar12 = uVar12 + 3) {
        uVar7 = video::A1R5G5B5toA8R8G8B8(*puVar15);
        uVar6 = PixelMul16_2((u16)uVar7,c1);
        if ((short)*puVar15 < 0) {
          uVar9 = uVar12 & 0xffffffff;
          *(undefined1 *)((long)pvVar10 + uVar9) = 0;
          *(char *)((long)pvVar10 + uVar9 + 1) = (char)(uVar6 >> 8);
          *(char *)((long)pvVar10 + uVar9 + 2) = (char)uVar6;
        }
        puVar15 = puVar15 + 1;
      }
      puVar11 = (u16 *)((long)puVar11 + (long)job->srcPitch);
      pvVar10 = (void *)((long)pvVar10 + (ulong)job->dstPitch);
    }
  }
  else {
    fVar1 = (float)job->x_stretch;
    fVar2 = (float)job->y_stretch;
    for (uVar8 = 0; uVar8 != uVar4; uVar8 = uVar8 + 1) {
      uVar13 = (int)(long)((float)uVar8 * fVar2) * job->srcPitch;
      pvVar5 = job->src;
      uVar14 = 0;
      for (uVar12 = 0; (ulong)uVar3 * 3 != uVar12; uVar12 = uVar12 + 3) {
        uVar9 = (long)((float)uVar14 * fVar1) & 0xffffffff;
        uVar7 = video::A1R5G5B5toA8R8G8B8(*(u16 *)((long)pvVar5 + uVar9 * 2 + (ulong)uVar13));
        uVar6 = PixelMul16_2((u16)uVar7,c1);
        if (*(short *)((long)pvVar5 + uVar9 * 2 + (ulong)uVar13) < 0) {
          uVar9 = uVar12 & 0xffffffff;
          *(undefined1 *)((long)pvVar10 + uVar9) = 0;
          *(char *)((long)pvVar10 + uVar9 + 1) = (char)(uVar6 >> 8);
          *(char *)((long)pvVar10 + uVar9 + 2) = (char)uVar6;
        }
        uVar14 = uVar14 + 1;
      }
      pvVar10 = (void *)((long)pvVar10 + (ulong)job->dstPitch);
    }
  }
  return;
}

Assistant:

static void executeBlit_TextureCombineColor_16_to_24(const SBlitJob *job)
{
	const u32 w = job->width;
	const u32 h = job->height;
	const u16 *src = static_cast<const u16 *>(job->src);
	u8 *dst = static_cast<u8 *>(job->dst);

	const u16 jobColor = video::A8R8G8B8toA1R5G5B5(job->argb);

	if (job->stretch) {
		const float wscale = job->x_stretch;
		const float hscale = job->y_stretch;

		for (u32 dy = 0; dy < h; ++dy) {
			const u32 src_y = (u32)(dy * hscale);
			src = (u16 *)((u8 *)(job->src) + job->srcPitch * src_y);

			for (u32 dx = 0; dx < w; ++dx) {
				const u32 src_x = (u32)(dx * wscale);
				u32 color = PixelMul16_2(video::A1R5G5B5toA8R8G8B8(src[src_x]), jobColor);
				u8 *writeTo = &dst[dx * 3];
				if (video::getAlpha(src[src_x]) > 0) { // only overlay if source has visible alpha (alpha == 1)
					*writeTo++ = (color >> 16) & 0xFF;
					*writeTo++ = (color >> 8) & 0xFF;
					*writeTo++ = color & 0xFF;
				}
			}
			dst += job->dstPitch;
		}
	} else {
		for (u32 dy = 0; dy != h; ++dy) {
			for (u32 dx = 0; dx != w; ++dx) {
				u32 color = PixelMul16_2(video::A1R5G5B5toA8R8G8B8(src[dx]), jobColor);
				u8 *writeTo = &dst[dx * 3];
				if (video::getAlpha(src[dx]) > 0) { // only overlay if source has visible alpha (alpha == 1)
					*writeTo++ = (color >> 16) & 0xFF;
					*writeTo++ = (color >> 8) & 0xFF;
					*writeTo++ = color & 0xFF;
				}
			}

			src = (u16 *)((u8 *)(src) + job->srcPitch);
			dst += job->dstPitch;
		}
	}
}